

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_sync_client_impl_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_service *tservice)

{
  int iVar1;
  undefined4 extraout_var;
  string local_40;
  t_service *local_20;
  t_service *tservice_local;
  t_rs_generator *this_local;
  
  local_20 = tservice;
  tservice_local = (t_service *)this;
  this_local = (t_rs_generator *)__return_storage_ptr__;
  iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  rust_camel_case(&local_40,this,(string *)CONCAT44(extraout_var,iVar1));
  std::operator+(__return_storage_ptr__,&local_40,"SyncClient");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_sync_client_impl_name(t_service* tservice) {
  return rust_camel_case(tservice->get_name()) + "SyncClient";
}